

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
::Subst_Forward(TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
                *this,TPZFMatrix<std::complex<long_double>_> *b)

{
  undefined8 in_RSI;
  TPZFMatrix<std::complex<long_double>_> *in_RDI;
  TPZStackEqnStorage<std::complex<long_double>_> *unaff_retaddr;
  DecomposeType dec;
  DecomposeType dec_00;
  TPZFMatrix<std::complex<long_double>_> *f;
  
  dec_00 = (DecomposeType)((ulong)in_RSI >> 0x20);
  f = in_RDI;
  std::operator<<((ostream *)&std::cout,"Entering Forward Substitution\n");
  std::ostream::flush();
  TPZFront<std::complex<long_double>_>::GetDecomposeType
            ((TPZFront<std::complex<long_double>_> *)&in_RDI[0xa07].fElem);
  TPZStackEqnStorage<std::complex<long_double>_>::Forward(unaff_retaddr,f,dec_00);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Forward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Forward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Forward(*b, dec);
	return 1;
}